

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O2

bool __thiscall duckdb::WindowHashGroup::TryPrepareNextStage(WindowHashGroup *this)

{
  WindowGroupStage WVar1;
  bool bVar2;
  
  ::std::mutex::lock(&this->lock);
  WVar1 = (this->stage)._M_i;
  bVar2 = true;
  if (WVar1 == FINALIZE) {
    WVar1 = GETDATA;
    if ((this->finalized).super___atomic_base<unsigned_long>._M_i != this->blocks) {
LAB_01888db2:
      bVar2 = false;
      goto LAB_01888db4;
    }
  }
  else {
    if (WVar1 != SINK) goto LAB_01888db4;
    WVar1 = FINALIZE;
    if ((this->sunk).super___atomic_base<unsigned_long>._M_i != this->count) goto LAB_01888db2;
  }
  LOCK();
  (this->stage)._M_i = WVar1;
  UNLOCK();
LAB_01888db4:
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return bVar2;
}

Assistant:

bool TryPrepareNextStage() {
		lock_guard<mutex> prepare_guard(lock);
		switch (stage.load()) {
		case WindowGroupStage::SINK:
			if (sunk == count) {
				stage = WindowGroupStage::FINALIZE;
				return true;
			}
			return false;
		case WindowGroupStage::FINALIZE:
			if (finalized == blocks) {
				stage = WindowGroupStage::GETDATA;
				return true;
			}
			return false;
		default:
			// never block in GETDATA
			return true;
		}
	}